

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O1

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::ModuleSplitter::exportImportFunction
          (ModuleSplitter *this,Name funcName)

{
  char **ppcVar1;
  Config *pCVar2;
  Module *pMVar3;
  char *pcVar4;
  Name name;
  Name name_00;
  iterator iVar5;
  long *plVar6;
  Export *pEVar7;
  _Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> *p_Var8;
  string_view *psVar9;
  Function *pFVar10;
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> _Var11;
  string_view sVar12;
  string_view s;
  string_view s_00;
  Name name_01;
  undefined1 auStack_88 [8];
  Name funcName_local;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  long local_68 [2];
  Expression local_58;
  size_t local_48;
  _Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> _Stack_40;
  
  funcName_local.super_IString.str._M_len = funcName.super_IString.str._M_str;
  auStack_88 = funcName.super_IString.str._M_len;
  iVar5 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
          ::find(&(this->exportedPrimaryFuncs)._M_t,(key_type *)auStack_88);
  if ((_Rb_tree_header *)iVar5._M_node ==
      &(this->exportedPrimaryFuncs)._M_t._M_impl.super__Rb_tree_header) {
    pCVar2 = this->config;
    if (pCVar2->minimizeNewExportNames == true) {
      do {
        pCVar2 = this->config;
        ppcVar1 = &funcName_local.super_IString.str._M_str;
        Names::MinifiedNameGenerator::getName_abi_cxx11_((string *)ppcVar1,&this->minified);
        plVar6 = (long *)std::__cxx11::string::replace
                                   ((ulong)ppcVar1,0,(char *)0x0,
                                    (ulong)(pCVar2->newExportPrefix)._M_dataplus._M_p);
        pEVar7 = (Export *)(plVar6 + 2);
        if ((Export *)*plVar6 == pEVar7) {
          local_48 = *(size_t *)&(pEVar7->name).super_IString;
          _Stack_40.super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
               (_Head_base<0UL,_wasm::Export_*,_false>)plVar6[3];
          local_58._0_8_ = &local_48;
        }
        else {
          local_48 = *(size_t *)&(pEVar7->name).super_IString;
          local_58._0_8_ = (Export *)*plVar6;
        }
        local_58.type.id = plVar6[1];
        *plVar6 = (long)pEVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        s._M_str = (char *)0x0;
        s._M_len = local_58._0_8_;
        sVar12 = IString::interned((IString *)local_58.type.id,s,SUB81(pEVar7,0));
        if ((size_t *)local_58._0_8_ != &local_48) {
          operator_delete((void *)local_58._0_8_,local_48 + 1);
        }
        if ((long *)funcName_local.super_IString.str._M_str != local_68) {
          operator_delete(funcName_local.super_IString.str._M_str,local_68[0] + 1);
        }
        pEVar7 = Module::getExportOrNull(this->primary,(Name)sVar12);
      } while (pEVar7 != (Export *)0x0);
    }
    else {
      pMVar3 = this->primary;
      ppcVar1 = &funcName_local.super_IString.str._M_str;
      funcName_local.super_IString.str._M_str = (char *)local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)ppcVar1,funcName_local.super_IString.str._M_len,
                 (char *)((long)auStack_88 + funcName_local.super_IString.str._M_len));
      p_Var8 = (_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> *)
               std::__cxx11::string::replace
                         ((ulong)ppcVar1,0,(char *)0x0,
                          (ulong)(pCVar2->newExportPrefix)._M_dataplus._M_p);
      _Var11._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
           (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)(p_Var8 + 2);
      if ((tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)
          p_Var8->super__Head_base<0UL,_wasm::Export_*,_false> ==
          (_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>)
          _Var11._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
          super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl) {
        local_48 = *(size_t *)
                    _Var11._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        _Stack_40.super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
             p_Var8[3].super__Head_base<0UL,_wasm::Export_*,_false>;
        local_58._0_8_ = &local_48;
      }
      else {
        local_48 = *(size_t *)
                    _Var11._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        local_58._0_8_ = (Export *)p_Var8->super__Head_base<0UL,_wasm::Export_*,_false>;
      }
      local_58.type.id = *(uintptr_t *)&p_Var8[1].super__Head_base<0UL,_wasm::Export_*,_false>;
      p_Var8->super__Head_base<0UL,_wasm::Export_*,_false> =
           (_Head_base<0UL,_wasm::Export_*,_false>)
           _Var11._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      p_Var8[1].super__Head_base<0UL,_wasm::Export_*,_false> = (Export *)0x0;
      *(undefined1 *)&p_Var8[2].super__Head_base<0UL,_wasm::Export_*,_false> = 0;
      s_00._M_str = (char *)0x0;
      s_00._M_len = local_58._0_8_;
      sVar12 = IString::interned((IString *)local_58.type.id,s_00,
                                 _Var11._M_t.
                                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                 .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl._0_1_);
      sVar12 = (string_view)Names::getValidExportName(pMVar3,(Name)sVar12);
      if ((size_t *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,local_48 + 1);
      }
      if ((long *)funcName_local.super_IString.str._M_str != local_68) {
        operator_delete(funcName_local.super_IString.str._M_str,local_68[0] + 1);
      }
    }
    pMVar3 = this->primary;
    local_58._0_8_ = operator_new(0x30);
    ((string_view *)(local_58._0_8_ + 0x10))->_M_str = (char *)auStack_88;
    ((string_view *)(local_58._0_8_ + 0x20))->_M_len = funcName_local.super_IString.str._M_len;
    *(string_view *)local_58._0_8_ = sVar12;
    *(undefined4 *)&((string_view *)(local_58._0_8_ + 0x10))->_M_len = 0;
    *(undefined1 *)&((string_view *)(local_58._0_8_ + 0x20))->_M_str = 0;
    Module::addExport(pMVar3,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                             &local_58);
    if ((_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>)local_58._0_8_ !=
        (Export *)0x0) {
      operator_delete((void *)local_58._0_8_,0x30);
    }
    psVar9 = (string_view *)
             std::
             map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
             ::operator[](&this->exportedPrimaryFuncs,(key_type *)auStack_88);
    *psVar9 = sVar12;
  }
  else {
    sVar12._M_len = (size_t)iVar5._M_node[1]._M_left;
    sVar12._M_str = (char *)iVar5._M_node[1]._M_right;
  }
  name.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)auStack_88;
  pFVar10 = Module::getFunctionOrNull(this->secondary,name);
  if (pFVar10 == (Function *)0x0) {
    name_00.super_IString.str._M_str = (char *)funcName_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)auStack_88;
    pFVar10 = Module::getFunction(this->primary,name_00);
    local_58._0_8_ = (Export *)0x0;
    local_58.type.id = 0;
    local_48 = 0;
    name_01.super_IString.str._M_str = (char *)auStack_88;
    name_01.super_IString.str._M_len = (size_t)&funcName_local.super_IString.str._M_str;
    Builder::makeFunction
              (name_01,(HeapType)funcName_local.super_IString.str._M_len,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)(pFVar10->type).id,&local_58);
    if ((Export *)local_58._0_8_ != (Export *)0x0) {
      operator_delete((void *)local_58._0_8_,local_48 - local_58._0_8_);
    }
    funcName_local.super_IString.str._M_str[0x10] =
         (pFVar10->super_Importable).super_Named.hasExplicitName;
    pcVar4 = (this->config->importNamespace).super_IString.str._M_str;
    *(size_t *)(funcName_local.super_IString.str._M_str + 0x18) =
         (this->config->importNamespace).super_IString.str._M_len;
    *(char **)(funcName_local.super_IString.str._M_str + 0x20) = pcVar4;
    *(string_view *)(funcName_local.super_IString.str._M_str + 0x28) = sVar12;
    Module::addFunction(this->secondary,
                        (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        &funcName_local.super_IString.str._M_str);
    if (funcName_local.super_IString.str._M_str != (char *)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)&funcName_local.super_IString.str._M_str,
                 (Function *)funcName_local.super_IString.str._M_str);
    }
  }
  return;
}

Assistant:

void ModuleSplitter::exportImportFunction(Name funcName) {
  Name exportName;
  // If the function is already exported, use the existing export name.
  // Otherwise, create a new export for it.
  auto exportIt = exportedPrimaryFuncs.find(funcName);
  if (exportIt != exportedPrimaryFuncs.end()) {
    exportName = exportIt->second;
  } else {
    if (config.minimizeNewExportNames) {
      do {
        exportName = config.newExportPrefix + minified.getName();
      } while (primary.getExportOrNull(exportName) != nullptr);
    } else {
      exportName = Names::getValidExportName(
        primary, config.newExportPrefix + funcName.toString());
    }
    primary.addExport(
      Builder::makeExport(exportName, funcName, ExternalKind::Function));
    exportedPrimaryFuncs[funcName] = exportName;
  }
  // Import the function if it is not already imported into the secondary
  // module.
  if (secondary.getFunctionOrNull(funcName) == nullptr) {
    auto primaryFunc = primary.getFunction(funcName);
    auto func = Builder::makeFunction(funcName, primaryFunc->type, {});
    func->hasExplicitName = primaryFunc->hasExplicitName;
    func->module = config.importNamespace;
    func->base = exportName;
    secondary.addFunction(std::move(func));
  }
}